

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_mul_into(mp_int *r,mp_int *a,mp_int *b)

{
  size_t nw;
  mp_int *x;
  mp_int *scratch;
  mp_int *b_local;
  mp_int *a_local;
  mp_int *r_local;
  
  nw = mp_mul_scratchspace(r->nw,a->nw,b->nw);
  x = mp_make_sized(nw);
  mp_mul_internal(r,a,b,*x);
  mp_free(x);
  return;
}

Assistant:

void mp_mul_into(mp_int *r, mp_int *a, mp_int *b)
{
    mp_int *scratch = mp_make_sized(mp_mul_scratchspace(r->nw, a->nw, b->nw));
    mp_mul_internal(r, a, b, *scratch);
    mp_free(scratch);
}